

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

CURLcode tool_setopt_offt(CURL *curl,GlobalConfig *global,char *name,CURLoption tag,curl_off_t lval)

{
  CURLcode local_34;
  CURLcode ret;
  curl_off_t lval_local;
  CURLoption tag_local;
  char *name_local;
  GlobalConfig *global_local;
  CURL *curl_local;
  
  local_34 = curl_easy_setopt(curl,tag,lval);
  if (((global->libcurl != (char *)0x0) && (local_34 == CURLE_OK)) && (lval != 0)) {
    local_34 = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, (curl_off_t)%ld);",name,lval);
  }
  return local_34;
}

Assistant:

CURLcode tool_setopt_offt(CURL *curl, struct GlobalConfig *global,
                          const char *name, CURLoption tag,
                          curl_off_t lval)
{
  CURLcode ret = CURLE_OK;
  DEBUGASSERT((tag >= CURLOPTTYPE_OFF_T) && (tag < CURLOPTTYPE_BLOB));

  ret = curl_easy_setopt(curl, tag, lval);
  if(global->libcurl && !ret && lval) {
    /* we only use this for real if --libcurl was used */
    ret = easysrc_addf(&easysrc_code, "curl_easy_setopt(hnd, %s, (curl_off_t)%"
          CURL_FORMAT_CURL_OFF_T ");", name, lval);
  }

  return ret;
}